

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int run_test_ipc_listen_before_write(void)

{
  undefined8 uVar1;
  char *pcVar2;
  
  run_ipc_test("ipc_helper_listen_before_write",on_read);
  if (local_conn_accepted == '\0') {
    pcVar2 = "local_conn_accepted == 1";
    uVar1 = 0x1cf;
  }
  else if (remote_conn_accepted == '\0') {
    pcVar2 = "remote_conn_accepted == 1";
    uVar1 = 0x1d0;
  }
  else if (read_cb_called == 1) {
    if (exit_cb_called == 1) {
      return 0;
    }
    pcVar2 = "exit_cb_called == 1";
    uVar1 = 0x1d2;
  }
  else {
    pcVar2 = "read_cb_called == 1";
    uVar1 = 0x1d1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(ipc_listen_before_write) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_listen_before_write", on_read);
  ASSERT(local_conn_accepted == 1);
  ASSERT(remote_conn_accepted == 1);
  ASSERT(read_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  return r;
}